

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state,string_t x_data,
               string_t y_data,AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  bool bVar2;
  anon_union_16_2_67f50693_for_value local_30;
  anon_union_16_2_67f50693_for_value local_20;
  
  local_30.pointer.ptr = (char *)y_data.value._8_8_;
  local_30._0_8_ = y_data.value._0_8_;
  local_20.pointer.ptr = (char *)x_data.value._8_8_;
  local_20._0_8_ = x_data.value._0_8_;
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((puVar1 == (unsigned_long *)0x0) ||
     ((puVar1[binary->ridx >> 6] >> (binary->ridx & 0x3f) & 1) != 0)) {
    bVar2 = string_t::StringComparisonOperators::GreaterThan
                      (&state->value,(string_t *)&local_30.pointer);
    if (bVar2) {
      puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = (puVar1[binary->lidx >> 6] >> (binary->lidx & 0x3f) & 1) == 0;
      }
      Assign<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
                (state,(string_t *)&local_20.pointer,(string_t *)&local_30.pointer,bVar2);
    }
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}